

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

size_t gnuplotio::
       get_range_size<gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>,gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::vector<int,std::allocator<int>>>>>>
                 (PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *arg)

{
  bool bVar1;
  size_t sVar2;
  PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  i;
  PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_48;
  
  local_48.l.it._M_current = (arg->l).it._M_current;
  local_48.l.end._M_current = (arg->l).end._M_current;
  local_48.r.l.it._M_current = (arg->r).l.it._M_current;
  local_48.r.l.end._M_current = (arg->r).l.end._M_current;
  local_48.r.r.it._M_current = (arg->r).r.it._M_current;
  local_48.r.r.end._M_current = (arg->r).r.end._M_current;
  bVar1 = PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::is_end(&local_48);
  sVar2 = 0;
  while (!bVar1) {
    local_48.l.it._M_current = local_48.l.it._M_current + 1;
    local_48.r.l.it._M_current = local_48.r.l.it._M_current + 1;
    sVar2 = sVar2 + 1;
    local_48.r.r.it._M_current = local_48.r.r.it._M_current + 1;
    bVar1 = PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::is_end(&local_48);
  }
  return sVar2;
}

Assistant:

size_t get_range_size(const T &arg) {
    // FIXME - not the fastest way.  Implement a size() method for range.
    size_t ret = 0;
    for(T i=arg; !i.is_end(); i.inc()) ++ret;
    return ret;
}